

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary.cpp
# Opt level: O3

int __thiscall CBoundary::IsFound(CBoundary *this,CWire *pWire)

{
  CNet *pNet;
  int iVar1;
  
  if (pWire == (CWire *)0x0) {
    __assert_fail("pWire",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x135,"int CBoundary::IsFound(CWire *)");
  }
  pNet = (CNet *)(pWire->super_CObject).m_pParent;
  if (pNet != (CNet *)0x0) {
    iVar1 = IsFound(this,pNet);
    return iVar1;
  }
  __assert_fail("pWire->GetParent()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                ,0x136,"int CBoundary::IsFound(CWire *)");
}

Assistant:

int CBoundary::IsFound(CWire *pWire)
{
	//see if this wire is already crossing the boundary
	assert(pWire);
	assert(pWire->GetParent());
	return	IsFound(pWire->GetParent());
}